

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

DisasJumpType op_cj(DisasContext_conflict13 *s,DisasOps *o)

{
  uint uVar1;
  byte bVar2;
  DisasJumpType DVar3;
  TCGv_i64 cdest;
  ulong uVar4;
  int imm;
  DisasCompare_conflict2 local_38;
  
  uVar1 = (s->fields).presentO;
  if ((uVar1 & 0x10) == 0) {
LAB_00cc1197:
    __assert_fail("have_field1(s, o)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                  ,0x44d,
                  "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
                 );
  }
  uVar4 = (ulong)(s->fields).c[2];
  bVar2 = (byte)ltgt_cond[uVar4];
  local_38._0_1_ = bVar2;
  if ((s->insn->data != 0) && (local_38._0_1_ = bVar2 ^ 6, (0xc3c3UL >> (uVar4 & 0x3f) & 1) != 0)) {
    local_38._0_1_ = bVar2;
  }
  local_38.g2 = true;
  local_38.is_64 = true;
  local_38.g1 = true;
  local_38.u.s64.a = o->in1;
  local_38.u.s64.b = o->in2;
  if ((uVar1 >> 0x14 & 1) == 0) {
    if (((uVar1 >> 10 & 1) == 0) || ((uVar1 >> 0xd & 1) == 0)) goto LAB_00cc1197;
    imm = 0;
    cdest = get_address(s,0,(s->fields).c[3],(s->fields).c[6]);
    o->out = cdest;
  }
  else {
    imm = (s->fields).c[3];
    cdest = o->out;
  }
  DVar3 = help_branch(s,&local_38,(_Bool)((byte)(uVar1 >> 0x14) & 1),imm,cdest);
  return DVar3;
}

Assistant:

static DisasJumpType op_cj(DisasContext *s, DisasOps *o)
{
    int imm, m3 = get_field(s, m3);
    bool is_imm;
    DisasCompare c;

    c.cond = ltgt_cond[m3];
    if (s->insn->data) {
        c.cond = tcg_unsigned_cond(c.cond);
    }
    c.is_64 = c.g1 = c.g2 = true;
    c.u.s64.a = o->in1;
    c.u.s64.b = o->in2;

    is_imm = have_field(s, i4);
    if (is_imm) {
        imm = get_field(s, i4);
    } else {
        imm = 0;
        o->out = get_address(s, 0, get_field(s, b4),
                             get_field(s, d4));
    }

    return help_branch(s, &c, is_imm, imm, o->out);
}